

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O1

void TasGrid::Utils::transpose<float>(longlong M,longlong N,float *A,float *B)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar8 = M + 0x3f;
  if (-1 < M) {
    lVar8 = M;
  }
  lVar9 = N + 0x3f;
  if (-1 < N) {
    lVar9 = N;
  }
  lVar9 = ((lVar9 >> 6) + 1) - (ulong)((N & 0x3fU) == 0);
  lVar8 = (((lVar8 >> 6) + 1) - (ulong)((M & 0x3fU) == 0)) * lVar9;
  if (0 < lVar8) {
    lVar7 = 0;
    do {
      lVar1 = lVar7 / lVar9;
      lVar4 = lVar7 % lVar9;
      lVar12 = M + lVar1 * -0x40;
      lVar10 = 0x40;
      if (lVar12 < 0x40) {
        lVar10 = lVar12;
      }
      lVar11 = N + lVar4 * -0x40;
      lVar6 = 0x40;
      if (lVar11 < 0x40) {
        lVar6 = lVar11;
      }
      if (0 < lVar12) {
        pfVar2 = A + lVar1 * 0x40 + lVar4 * 0x40 * M;
        pfVar5 = B + lVar1 * 0x40 * N + lVar4 * 0x40;
        lVar1 = 0;
        do {
          if (0 < lVar11) {
            lVar4 = 0;
            pfVar3 = pfVar2;
            do {
              pfVar5[lVar4] = *pfVar3;
              lVar4 = lVar4 + 1;
              pfVar3 = pfVar3 + M;
            } while (lVar6 != lVar4);
          }
          lVar1 = lVar1 + 1;
          pfVar5 = pfVar5 + N;
          pfVar2 = pfVar2 + 1;
        } while (lVar1 != lVar10);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar8);
  }
  return;
}

Assistant:

void transpose(long long M, long long N, scalar_type const A[], scalar_type B[]){
    constexpr long long bsize = 64;
    long long bM = (M / bsize) + ((M % bsize == 0) ? 0 : 1); // number of blocks in M and N
    long long bN = (N / bsize) + ((N % bsize == 0) ? 0 : 1);
    #pragma omp parallel for
    for(long long t =0; t < bM * bN; t++){
        long long i = t / bN;
        long long j = t % bN;
        copy_transpose(std::min(bsize, M - i * bsize), std::min(bsize, N - j * bsize),
                        A + i * bsize + j * bsize * M, M,
                        B + i * bsize * N + j * bsize, N);
    }
}